

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_http_server.hpp
# Opt level: O2

void __thiscall
cinatra::coro_http_server::
set_http_handler<(cinatra::http_method)1,async_simple::coro::Lazy<void>(my_object::*)(cinatra::coro_http_request&,cinatra::coro_http_response&)>
          (coro_http_server *this,string *key,offset_in_my_object_to_subr handler,
          class_type_t<async_simple::coro::Lazy<void>_(my_object::*)(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)>
          *owner)

{
  function<async_simple::coro::Lazy<void>_(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)>
  f;
  _Any_data local_98;
  long local_88;
  undefined8 local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  _Any_data local_50;
  long local_40;
  undefined8 uStack_38;
  undefined1 local_30 [24];
  
  local_30._0_8_ = handler;
  local_30._8_8_ = owner;
  std::
  function<async_simple::coro::Lazy<void>(cinatra::coro_http_request&,cinatra::coro_http_response&)>
  ::
  function<std::_Bind<async_simple::coro::Lazy<void>(my_object::*(my_object*,std::_Placeholder<1>,std::_Placeholder<2>))(cinatra::coro_http_request&,cinatra::coro_http_response&)>,void>
            ((function<async_simple::coro::Lazy<void>(cinatra::coro_http_request&,cinatra::coro_http_response&)>
              *)local_50._M_pod_data,
             (_Bind<async_simple::coro::Lazy<void>_(my_object::*(my_object_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)>
              *)local_30);
  std::__cxx11::string::string(&local_70,key);
  local_98._M_unused._M_object = (void *)0x0;
  local_98._8_8_ = 0;
  local_88 = 0;
  local_80 = uStack_38;
  if (local_40 != 0) {
    local_98._M_unused._M_object = local_50._M_unused._M_object;
    local_98._8_8_ = local_50._8_8_;
    local_88 = local_40;
    local_40 = 0;
    uStack_38 = 0;
  }
  set_http_handler<(cinatra::http_method)1,std::function<async_simple::coro::Lazy<void>(cinatra::coro_http_request&,cinatra::coro_http_response&)>>
            (this,&local_70,
             (function<async_simple::coro::Lazy<void>_(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)>
              *)&local_98);
  std::_Function_base::~_Function_base((_Function_base *)&local_98);
  std::__cxx11::string::~string((string *)&local_70);
  std::_Function_base::~_Function_base((_Function_base *)&local_50);
  return;
}

Assistant:

void set_http_handler(std::string key, Func handler,
                        util::class_type_t<Func> &owner, Aspects &&...asps) {
    static_assert(std::is_member_function_pointer_v<Func>,
                  "must be member function");
    using return_type = typename util::function_traits<Func>::return_type;
    if constexpr (coro_io::is_lazy_v<return_type>) {
      std::function<async_simple::coro::Lazy<void>(coro_http_request & req,
                                                   coro_http_response & resp)>
          f = std::bind(handler, &owner, std::placeholders::_1,
                        std::placeholders::_2);
      set_http_handler<method...>(std::move(key), std::move(f),
                                  std::forward<Aspects>(asps)...);
    }
    else {
      std::function<void(coro_http_request & req, coro_http_response & resp)>
          f = std::bind(handler, &owner, std::placeholders::_1,
                        std::placeholders::_2);
      set_http_handler<method...>(std::move(key), std::move(f),
                                  std::forward<Aspects>(asps)...);
    }
  }